

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode curl_global_init_mem
                   (long flags,curl_malloc_callback m,curl_free_callback f,curl_realloc_callback r,
                   curl_strdup_callback s,curl_calloc_callback c)

{
  CURLcode code;
  curl_calloc_callback c_local;
  curl_strdup_callback s_local;
  curl_realloc_callback r_local;
  curl_free_callback f_local;
  curl_malloc_callback m_local;
  long flags_local;
  
  if ((((m == (curl_malloc_callback)0x0) || (f == (curl_free_callback)0x0)) ||
      (r == (curl_realloc_callback)0x0)) ||
     ((s == (curl_strdup_callback)0x0 || (c == (curl_calloc_callback)0x0)))) {
    flags_local._4_4_ = CURLE_FAILED_INIT;
  }
  else if (initialized == 0) {
    flags_local._4_4_ = curl_global_init(flags);
    if (flags_local._4_4_ == CURLE_OK) {
      Curl_cmalloc = m;
      Curl_cfree = f;
      Curl_crealloc = r;
      Curl_cstrdup = s;
      Curl_ccalloc = c;
    }
  }
  else {
    initialized = initialized + 1;
    flags_local._4_4_ = CURLE_OK;
  }
  return flags_local._4_4_;
}

Assistant:

CURLcode curl_global_init_mem(long flags, curl_malloc_callback m,
                              curl_free_callback f, curl_realloc_callback r,
                              curl_strdup_callback s, curl_calloc_callback c)
{
  CURLcode code = CURLE_OK;

  /* Invalid input, return immediately */
  if(!m || !f || !r || !s || !c)
    return CURLE_FAILED_INIT;

  if(initialized) {
    /* Already initialized, don't do it again, but bump the variable anyway to
       work like curl_global_init() and require the same amount of cleanup
       calls. */
    initialized++;
    return CURLE_OK;
  }

  /* Call the actual init function first */
  code = curl_global_init(flags);
  if(code == CURLE_OK) {
    Curl_cmalloc = m;
    Curl_cfree = f;
    Curl_cstrdup = s;
    Curl_crealloc = r;
    Curl_ccalloc = c;
  }

  return code;
}